

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

base_learner * cb_explore_adf_setup(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  bool bVar3;
  options_i *poVar4;
  vw *all_00;
  undefined8 uVar5;
  int iVar6;
  _func_int ***__dest;
  option_group_definition *poVar7;
  typed_option<float> *ptVar8;
  base_learner *l;
  multi_learner *base;
  multi_learner *pmVar9;
  learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
  *plVar10;
  long lVar11;
  cb_explore_adf *pcVar12;
  char cVar13;
  undefined **ppuVar14;
  label_parser *plVar15;
  size_t ws;
  byte bVar16;
  bool regcb;
  bool softmax;
  bool cb_explore_adf_option;
  string type_string;
  size_type __dnew_17;
  size_type __dnew;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew_2;
  size_type __dnew_16;
  size_type __dnew_14;
  size_type __dnew_11;
  size_type __dnew_9;
  size_type __dnew_8;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_15;
  size_type __dnew_13;
  size_type __dnew_12;
  size_type __dnew_10;
  size_type __dnew_5;
  bool local_fc3;
  bool local_fc2;
  bool local_fc1;
  cb_explore_adf *local_fc0;
  options_i *local_fb8;
  vw *local_fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa8;
  _func_int ***local_f88;
  _func_int **local_f80;
  _func_int **local_f78 [2];
  bool *local_f68;
  float *local_f60;
  float *local_f58;
  long local_f50;
  undefined1 local_f48 [112];
  bool local_ed8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ec0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_eb0;
  _func_int ***local_ea8;
  _func_int **local_ea0;
  _func_int **local_e98 [2];
  _func_int ***local_e88;
  _func_int **local_e80;
  _func_int **local_e78 [2];
  _func_int ***local_e68;
  _func_int **local_e60;
  _func_int **local_e58 [2];
  _func_int ***local_e48;
  _func_int **local_e40;
  _func_int **local_e38 [2];
  _func_int ***local_e28;
  _func_int **local_e20;
  _func_int **local_e18 [2];
  _func_int ***local_e08;
  _func_int **local_e00;
  _func_int **local_df8 [2];
  _func_int ***local_de8;
  _func_int **local_de0;
  _func_int **local_dd8 [2];
  _func_int ***local_dc8;
  _func_int **local_dc0;
  _func_int **local_db8 [2];
  _func_int ***local_da8;
  _func_int **local_da0;
  _func_int **local_d98 [2];
  _func_int ***local_d88;
  _func_int **local_d80;
  _func_int **local_d78 [2];
  _func_int ***local_d68;
  _func_int **local_d60;
  _func_int **local_d58 [2];
  _func_int ***local_d48;
  _func_int **local_d40;
  _func_int **local_d38 [2];
  _func_int ***local_d28;
  _func_int **local_d20;
  _func_int **local_d18 [2];
  _func_int ***local_d08;
  _func_int **local_d00;
  _func_int **local_cf8 [2];
  _func_int ***local_ce8;
  _func_int **local_ce0;
  _func_int **local_cd8 [2];
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  undefined1 local_b08 [112];
  bool local_a98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a70;
  option_group_definition local_a68;
  long *local_a30;
  long local_a28;
  long local_a20 [2];
  _func_int ***local_a10;
  _func_int **local_a08;
  _func_int **local_a00 [2];
  string local_9f0;
  string local_9d0;
  string local_9b0;
  undefined1 local_990 [112];
  bool local_920;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  undefined1 local_8f0 [112];
  bool local_880;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [112];
  bool local_7e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  undefined1 local_7b0 [112];
  bool local_740;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  undefined1 local_710 [112];
  bool local_6a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  undefined1 local_670 [112];
  bool local_600;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [112];
  bool local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [112];
  bool local_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [112];
  bool local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  typed_option<float> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  bVar16 = 0;
  local_fc0 = calloc_or_throw<CB_EXPLORE_ADF::cb_explore_adf>(1);
  memset(local_fc0,0,0x250);
  local_fc1 = false;
  local_fc2 = false;
  local_fc3 = false;
  local_fa8._M_dataplus._M_p = (pointer)&local_fa8.field_2;
  local_fa8.field_2._M_allocated_capacity._0_4_ = 0x72746d;
  local_fa8._M_string_length = 3;
  local_f48._0_8_ = (_func_int **)0x3c;
  local_f88 = local_f78;
  local_f88 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_f88,(ulong)local_f48);
  local_f78[0] = (_func_int **)local_f48._0_8_;
  builtin_strncpy((char *)((long)local_f88 + 0x2c),"pendent ",8);
  builtin_strncpy((char *)((long)local_f88 + 0x34),"Features",8);
  local_f88[4] = (_func_int **)0x6f69746341206874;
  local_f88[5] = (_func_int **)0x646e65706544206e;
  local_f88[2] = (_func_int **)0x726f6c7078452074;
  local_f88[3] = (_func_int **)0x6977206e6f697461;
  *(undefined4 *)local_f88 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_f88 + 4),"extu",4);
  *(undefined4 *)(local_f88 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_f88 + 0xc),"andi",4);
  local_f80 = (_func_int **)local_f48._0_8_;
  *(char *)((long)local_f88 + local_f48._0_8_) = '\0';
  local_a68.m_name._M_dataplus._M_p = (pointer)&local_a68.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a68,local_f88,(char *)(local_f48._0_8_ + (long)local_f88));
  local_a68.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a68.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a68.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_f88 != local_f78) {
    operator_delete(local_f88);
  }
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  local_b28.field_2._M_allocated_capacity._0_6_ = 0x7078655f6263;
  local_b28.field_2._M_allocated_capacity._6_2_ = 0x6f6c;
  local_b28.field_2._8_6_ = 0x6664615f6572;
  local_b28._M_string_length = 0xe;
  local_b28.field_2._M_local_buf[0xe] = '\0';
  local_fb8 = options;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f48,&local_b28,&local_fc1);
  local_ed8 = true;
  local_ce8 = local_cd8;
  local_b08._0_8_ = (_func_int **)0x5f;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ce8,(ulong)local_b08);
  uVar5 = local_b08._0_8_;
  local_cd8[0] = (_func_int **)local_b08._0_8_;
  local_ce8 = __dest;
  memcpy(__dest,
         "Online explore-exploit for a contextual bandit problem with multiline action dependent features"
         ,0x5f);
  local_ce0 = (_func_int **)uVar5;
  *(undefined1 *)((long)__dest + uVar5) = 0;
  std::__cxx11::string::_M_assign((string *)(local_f48 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_a68,(typed_option<bool> *)local_f48);
  pcVar12 = local_fc0;
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  local_b48.field_2._M_allocated_capacity._0_4_ = 0x73726966;
  local_b48.field_2._M_allocated_capacity._4_2_ = 0x74;
  local_b48._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_b08,&local_b48,&local_fc0->tau);
  local_a98 = true;
  local_d08 = local_cf8;
  local_990._0_8_ = (_func_int **)0x15;
  local_d08 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d08,(ulong)local_990);
  local_cf8[0] = (_func_int **)local_990._0_8_;
  *local_d08 = (_func_int **)0x737269662d756174;
  local_d08[1] = (_func_int **)0x726f6c7078652074;
  builtin_strncpy((char *)((long)local_d08 + 0xd),"loration",8);
  local_d00 = (_func_int **)local_990._0_8_;
  *(char *)((long)local_d08 + local_990._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_b08 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,(typed_option<unsigned_long> *)local_b08);
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  local_b68.field_2._M_allocated_capacity._0_4_ = 0x69737065;
  local_b68.field_2._M_allocated_capacity._4_3_ = 0x6e6f6c;
  local_b68._M_string_length = 7;
  local_b68.field_2._M_local_buf[7] = '\0';
  local_f60 = &pcVar12->epsilon;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_990,&local_b68,local_f60);
  local_920 = true;
  local_d28 = local_d18;
  local_3f0._0_8_ = (_func_int **)0x1a;
  local_d28 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d28,(ulong)local_3f0);
  local_d18[0] = (_func_int **)local_3f0._0_8_;
  builtin_strncpy((char *)((long)local_d28 + 10),"eedy exp",8);
  builtin_strncpy((char *)((long)local_d28 + 0x12),"loration",8);
  *local_d28 = (_func_int **)0x2d6e6f6c69737065;
  local_d28[1] = (_func_int **)0x6520796465657267;
  local_d20 = (_func_int **)local_3f0._0_8_;
  *(char *)((long)local_d28 + local_3f0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_990);
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  local_b88.field_2._M_allocated_capacity._0_4_ = 0x676162;
  local_b88._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_3f0,&local_b88,&pcVar12->bag_size);
  local_380 = true;
  local_d48 = local_d38;
  local_490._0_8_ = (_func_int **)0x19;
  local_d48 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d48,(ulong)local_490);
  local_d38[0] = (_func_int **)local_490._0_8_;
  builtin_strncpy((char *)((long)local_d48 + 9),"ased exp",8);
  builtin_strncpy((char *)((long)local_d48 + 0x11),"loration",8);
  *local_d48 = (_func_int **)0x2d676e6967676162;
  local_d48[1] = (_func_int **)0x7865206465736162;
  local_d40 = (_func_int **)local_490._0_8_;
  *(char *)((long)local_d48 + local_490._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,(typed_option<unsigned_long> *)local_3f0);
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  local_ba8.field_2._M_allocated_capacity._0_4_ = 0x65766f63;
  local_ba8.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_ba8._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_490,&local_ba8,&pcVar12->cover_size);
  local_420 = true;
  local_d68 = local_d58;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_d68 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d68,(ulong)&local_d0);
  local_d58[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_d68 + 0xe),"ased exp",8);
  builtin_strncpy((char *)((long)local_d68 + 0x16),"loration",8);
  *local_d68 = (_func_int **)0x6320656e696c6e4f;
  local_d68[1] = (_func_int **)0x736162207265766f;
  local_d60 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_d68 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,(typed_option<unsigned_long> *)local_490);
  local_bc8._M_dataplus._M_p = (pointer)&local_bc8.field_2;
  local_bc8.field_2._M_allocated_capacity._0_4_ = 0x697370;
  local_bc8._M_string_length = 3;
  VW::config::typed_option<float>::typed_option(&local_d0,&local_bc8,&pcVar12->psi);
  local_d0.super_base_option.m_keep = true;
  ptVar8 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_d88 = local_d78;
  local_530._0_8_ = (_func_int **)0x20;
  local_d88 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_d88,(ulong)local_530);
  local_d78[0] = (_func_int **)local_530._0_8_;
  local_d88[2] = (_func_int **)0x6620726574656d61;
  local_d88[3] = (_func_int **)0x7265766f6320726f;
  *local_d88 = (_func_int **)0x6565726761736964;
  local_d88[1] = (_func_int **)0x72617020746e656d;
  local_d80 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_d88 + local_530._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  local_be8.field_2._M_allocated_capacity._0_4_ = 0x6e756f6e;
  local_be8.field_2._M_allocated_capacity._4_2_ = 0x6669;
  local_be8._M_string_length = 6;
  local_be8.field_2._M_local_buf[6] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_be8,&pcVar12->nounif);
  local_4c0 = true;
  local_da8 = local_d98;
  local_5d0._0_8_ = (_func_int **)0x3d;
  local_da8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_da8,(ulong)local_5d0);
  local_d98[0] = (_func_int **)local_5d0._0_8_;
  builtin_strncpy((char *)((long)local_da8 + 0x2d),"actions ",8);
  builtin_strncpy((char *)((long)local_da8 + 0x35),"in cover",8);
  local_da8[4] = (_func_int **)0x696261626f72702d;
  local_da8[5] = (_func_int **)0x746361207974696c;
  local_da8[2] = (_func_int **)0x796c6d726f66696e;
  local_da8[3] = (_func_int **)0x6f72657a206e6f20;
  *local_da8 = (_func_int **)0x6520746f6e206f64;
  local_da8[1] = (_func_int **)0x752065726f6c7078;
  local_da0 = (_func_int **)local_5d0._0_8_;
  *(char *)((long)local_da8 + local_5d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_530);
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  local_c08.field_2._M_allocated_capacity._0_4_ = 0x74666f73;
  local_c08.field_2._M_allocated_capacity._4_3_ = 0x78616d;
  local_c08._M_string_length = 7;
  local_c08.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_c08,&local_fc2);
  local_560 = true;
  local_dc8 = local_db8;
  local_670._0_8_ = (_func_int **)0x13;
  local_dc8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_dc8,(ulong)local_670);
  local_db8[0] = (_func_int **)local_670._0_8_;
  *local_dc8 = (_func_int **)0x2078616d74666f73;
  local_dc8[1] = (_func_int **)0x7461726f6c707865;
  builtin_strncpy((char *)((long)local_dc8 + 0xf),"tion",4);
  local_dc0 = (_func_int **)local_670._0_8_;
  *(char *)((long)local_dc8 + local_670._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_5d0);
  local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
  local_c28.field_2._M_allocated_capacity._0_4_ = 0x63676572;
  local_c28.field_2._M_allocated_capacity._4_2_ = 0x62;
  local_c28._M_string_length = 5;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_c28,&local_fc3);
  local_600 = true;
  local_de8 = local_dd8;
  local_710._0_8_ = (_func_int **)0x16;
  local_de8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_de8,(ulong)local_710);
  local_dd8[0] = (_func_int **)local_710._0_8_;
  *local_de8 = (_func_int **)0x6c652d4243676552;
  local_de8[1] = (_func_int **)0x6f6c707865206d69;
  builtin_strncpy((char *)((long)local_de8 + 0xe),"loration",8);
  local_de0 = (_func_int **)local_710._0_8_;
  *(char *)((long)local_de8 + local_710._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_670);
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  local_c48.field_2._M_allocated_capacity = 0x74706f6263676572;
  local_c48._M_string_length = 8;
  local_c48.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_c48,&pcVar12->regcbopt);
  local_6a0 = true;
  local_e08 = local_df8;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x1c;
  local_e08 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e08,(ulong)&local_170);
  local_df8[0] = local_170.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_e08 + 0xc),"stic exp",8);
  builtin_strncpy((char *)((long)local_e08 + 0x14),"loration",8);
  *local_e08 = (_func_int **)0x706f204243676552;
  local_e08[1] = (_func_int **)0x63697473696d6974;
  local_e00 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_e08 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_710);
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  local_c68.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_c68.field_2._8_2_ = 0x7373;
  local_c68._M_string_length = 10;
  local_c68.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_170,&local_c68,&pcVar12->c0);
  local_170.super_base_option.m_keep = true;
  ptVar8 = VW::config::typed_option<float>::default_value(&local_170,0.1);
  local_e28 = local_e18;
  local_7b0._0_8_ = (_func_int **)0x2b;
  local_e28 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e28,(ulong)local_7b0);
  local_e18[0] = (_func_int **)local_7b0._0_8_;
  builtin_strncpy((char *)((long)local_e28 + 0x1b),"c_0. Def",8);
  builtin_strncpy((char *)((long)local_e28 + 0x23),"ault 0.1",8);
  local_e28[2] = (_func_int **)0x74656d6172617020;
  local_e28[3] = (_func_int **)0x202e305f63207265;
  *local_e28 = (_func_int **)0x656d204243676552;
  local_e28[1] = (_func_int **)0x7373656e776f6c6c;
  local_e20 = (_func_int **)local_7b0._0_8_;
  *(char *)((long)local_e28 + local_7b0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  local_c88.field_2._M_allocated_capacity = 0x7966696465657267;
  local_c88._M_string_length = 8;
  local_c88.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7b0,&local_c88,&pcVar12->greedify);
  local_740 = true;
  local_e48 = local_e38;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x2a;
  local_e48 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e48,(ulong)&local_210);
  local_e38[0] = local_210.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_e48 + 0x1a)," once in",8);
  builtin_strncpy((char *)((long)local_e48 + 0x22)," bagging",8);
  local_e48[2] = (_func_int **)0x696c6f7020747372;
  local_e48[3] = (_func_int **)0x2065636e6f207963;
  *local_e48 = (_func_int **)0x7520737961776c61;
  local_e48[1] = (_func_int **)0x6966206574616470;
  local_e40 = local_210.super_base_option._vptr_base_option;
  *(char *)((long)local_e48 + (long)local_210.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_7b0);
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  local_ca8.field_2._M_allocated_capacity._0_7_ = 0x5f6e696d5f6263;
  local_ca8.field_2._7_4_ = 0x74736f63;
  local_ca8._M_string_length = 0xb;
  local_ca8.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<float>::typed_option(&local_210,&local_ca8,&pcVar12->min_cb_cost);
  local_210.super_base_option.m_keep = true;
  ptVar8 = VW::config::typed_option<float>::default_value(&local_210,0.0);
  local_e68 = local_e58;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x13;
  local_e68 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e68,(ulong)&local_2b0);
  local_e58[0] = local_2b0.super_base_option._vptr_base_option;
  *local_e68 = (_func_int **)0x6f62207265776f6c;
  local_e68[1] = (_func_int **)0x63206e6f20646e75;
  builtin_strncpy((char *)((long)local_e68 + 0xf),"cost",4);
  local_e60 = local_2b0.super_base_option._vptr_base_option;
  *(char *)((long)local_e68 + (long)local_2b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  local_cc8.field_2._M_allocated_capacity._0_7_ = 0x5f78616d5f6263;
  local_cc8.field_2._7_4_ = 0x74736f63;
  local_cc8._M_string_length = 0xb;
  local_cc8.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_cc8,&pcVar12->max_cb_cost);
  local_2b0.super_base_option.m_keep = true;
  ptVar8 = VW::config::typed_option<float>::default_value(&local_2b0,1.0);
  local_e88 = local_e78;
  local_850._0_8_ = (_func_int **)0x13;
  local_e88 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_e88,(ulong)local_850);
  local_e78[0] = (_func_int **)local_850._0_8_;
  *local_e88 = (_func_int **)0x6f62207265707075;
  local_e88[1] = (_func_int **)0x63206e6f20646e75;
  builtin_strncpy((char *)((long)local_e88 + 0xf),"cost",4);
  local_e80 = (_func_int **)local_850._0_8_;
  *(char *)((long)local_e88 + local_850._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_9b0.field_2._M_allocated_capacity = 0x6e6f5f7473726966;
  local_9b0.field_2._8_2_ = 0x796c;
  local_9b0._M_string_length = 10;
  local_9b0.field_2._M_local_buf[10] = '\0';
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_850,&local_9b0,&pcVar12->first_only);
  local_7e0 = true;
  local_ea8 = local_e98;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x35;
  local_ea8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ea8,(ulong)&local_350);
  local_e98[0] = local_350.super_base_option._vptr_base_option;
  local_ea8[4] = (_func_int **)0x622d656974206120;
  local_ea8[5] = (_func_int **)0x20676e696b616572;
  local_ea8[2] = (_func_int **)0x6120747372696620;
  local_ea8[3] = (_func_int **)0x6e69206e6f697463;
  *local_ea8 = (_func_int **)0x70786520796c6e4f;
  local_ea8[1] = (_func_int **)0x6568742065726f6c;
  builtin_strncpy((char *)((long)local_ea8 + 0x2d),"ng event",8);
  local_ea0 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_ea8 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  local_f68 = &pcVar12->regcbopt;
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_850);
  local_9d0.field_2._M_allocated_capacity._0_4_ = 0x626d616c;
  local_9d0.field_2._M_allocated_capacity._4_2_ = 0x6164;
  local_9d0._M_string_length = 6;
  local_9d0.field_2._M_local_buf[6] = '\0';
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  VW::config::typed_option<float>::typed_option(&local_350,&local_9d0,&pcVar12->lambda);
  local_350.super_base_option.m_keep = true;
  local_fb0 = all;
  ptVar8 = VW::config::typed_option<float>::default_value(&local_350,-1.0);
  local_8f0._0_8_ = (_func_int **)0x15;
  local_a10 = local_a00;
  local_a10 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a10,(ulong)local_8f0);
  local_a00[0] = (_func_int **)local_8f0._0_8_;
  *local_a10 = (_func_int **)0x6574656d61726170;
  local_a10[1] = (_func_int **)0x6f7320726f662072;
  builtin_strncpy((char *)((long)local_a10 + 0xd)," softmax",8);
  local_a08 = (_func_int **)local_8f0._0_8_;
  *(char *)((long)local_a10 + local_8f0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_9f0.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_9f0.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_9f0._M_string_length = 7;
  local_9f0.field_2._M_local_buf[7] = '\0';
  local_f58 = &pcVar12->lambda;
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8f0,&local_9f0,&local_fa8);
  local_880 = true;
  local_f50 = 0x3d;
  local_a30 = local_a20;
  local_a30 = (long *)std::__cxx11::string::_M_create((ulong *)&local_a30,(ulong)&local_f50);
  local_a20[0] = local_f50;
  builtin_strncpy((char *)((long)local_a30 + 0x2d),"r}. Defa",8);
  builtin_strncpy((char *)((long)local_a30 + 0x35),"ult: mtr",8);
  local_a30[4] = 0x2c7370697b206e69;
  local_a30[5] = 0x2e7d72746d2c7264;
  local_a30[2] = 0x646f6874656d2074;
  local_a30[3] = 0x20657375206f7420;
  *local_a30 = 0x75747865746e6f63;
  local_a30[1] = 0x69646e6162206c61;
  local_a28 = local_f50;
  *(char *)((long)local_a30 + local_f50) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_8f0);
  if (local_a30 != local_a20) {
    operator_delete(local_a30);
  }
  pcVar12 = local_fc0;
  local_8f0._0_8_ = &PTR__typed_option_002d8568;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p);
  }
  if (local_a10 != local_a00) {
    operator_delete(local_a10);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p);
  }
  if (local_ea8 != local_e98) {
    operator_delete(local_ea8);
  }
  local_850._0_8_ = &PTR__typed_option_002d8500;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p);
  }
  if (local_e88 != local_e78) {
    operator_delete(local_e88);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p);
  }
  if (local_e68 != local_e58) {
    operator_delete(local_e68);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p);
  }
  if (local_e48 != local_e38) {
    operator_delete(local_e48);
  }
  local_7b0._0_8_ = &PTR__typed_option_002d8500;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_e28 != local_e18) {
    operator_delete(local_e28);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p);
  }
  if (local_e08 != local_df8) {
    operator_delete(local_e08);
  }
  local_710._0_8_ = &PTR__typed_option_002d8500;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if (local_de8 != local_dd8) {
    operator_delete(local_de8);
  }
  local_670._0_8_ = &PTR__typed_option_002d8500;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p);
  }
  if (local_dc8 != local_db8) {
    operator_delete(local_dc8);
  }
  local_5d0._0_8_ = &PTR__typed_option_002d8500;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if (local_da8 != local_d98) {
    operator_delete(local_da8);
  }
  local_530._0_8_ = &PTR__typed_option_002d8500;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p);
  }
  if (local_d88 != local_d78) {
    operator_delete(local_d88);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc8._M_dataplus._M_p != &local_bc8.field_2) {
    operator_delete(local_bc8._M_dataplus._M_p);
  }
  if (local_d68 != local_d58) {
    operator_delete(local_d68);
  }
  local_490._0_8_ = &PTR__typed_option_002d85d8;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if (local_d48 != local_d38) {
    operator_delete(local_d48);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d85d8;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p);
  }
  if (local_d28 != local_d18) {
    operator_delete(local_d28);
  }
  local_990._0_8_ = &PTR__typed_option_002d8610;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p);
  }
  if (local_d08 != local_cf8) {
    operator_delete(local_d08);
  }
  local_b08._0_8_ = &PTR__typed_option_002d85d8;
  if (local_a70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a70._M_pi);
  }
  if (local_a80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a80._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  if (local_ce8 != local_cd8) {
    operator_delete(local_ce8);
  }
  local_f48._0_8_ = &PTR__typed_option_002d8500;
  if (local_eb0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_eb0._M_pi);
  }
  poVar4 = local_fb8;
  if (local_ec0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ec0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p);
  }
  (**poVar4->_vptr_options_i)(poVar4,&local_a68);
  all_00 = local_fb0;
  if (local_fc1 == false) {
    plVar10 = (learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
               *)0x0;
  }
  else {
    pp_Var2 = (_func_int **)(local_f48 + 0x10);
    local_f48._8_8_ = (pointer)0x7;
    local_f48._16_8_ = 0x657079745f6263;
    local_f48._0_8_ = pp_Var2;
    iVar6 = (*poVar4->_vptr_options_i[1])(poVar4,local_f48);
    if ((_func_int **)local_f48._0_8_ != pp_Var2) {
      operator_delete((void *)local_f48._0_8_);
    }
    poVar4 = local_fb8;
    if ((char)iVar6 == '\0') {
      local_f48._8_8_ = (pointer)0x7;
      local_f48._16_8_ = 0x657079745f6263;
      local_f48._0_8_ = pp_Var2;
      (*local_fb8->_vptr_options_i[5])(local_fb8,local_f48,&local_fa8);
      if ((_func_int **)local_f48._0_8_ != pp_Var2) {
        operator_delete((void *)local_f48._0_8_);
      }
      (**poVar4->_vptr_options_i)(poVar4,&local_a68);
    }
    pcVar12->all = all_00;
    if (0.0 < pcVar12->lambda) {
      *local_f58 = -pcVar12->lambda;
    }
    local_f48._8_8_ = (pointer)0x6;
    local_f48._16_7_ = 0x6664615f6263;
    local_f48._0_8_ = pp_Var2;
    iVar6 = (*poVar4->_vptr_options_i[1])(poVar4);
    if ((_func_int **)local_f48._0_8_ != pp_Var2) {
      operator_delete((void *)local_f48._0_8_);
    }
    if ((char)iVar6 == '\0') {
      local_f48._8_8_ = (pointer)0x6;
      local_f48._16_7_ = 0x6664615f6263;
      local_b08._8_8_ = (pointer)0x0;
      local_b08[0x10] = 0;
      local_f48._0_8_ = pp_Var2;
      local_b08._0_8_ = local_b08 + 0x10;
      (*poVar4->_vptr_options_i[5])(poVar4,local_f48,local_b08);
      if ((undefined1 *)local_b08._0_8_ != local_b08 + 0x10) {
        operator_delete((void *)local_b08._0_8_);
      }
      pcVar12 = local_fc0;
      if ((_func_int **)local_f48._0_8_ != pp_Var2) {
        operator_delete((void *)local_f48._0_8_);
      }
    }
    all_00->delete_prediction = ACTION_SCORE::delete_action_scores;
    local_f48._16_6_ = 0x7265766f63;
    local_f48._8_8_ = (pointer)0x5;
    local_f48._0_8_ = pp_Var2;
    iVar6 = (*poVar4->_vptr_options_i[1])(poVar4);
    if ((_func_int **)local_f48._0_8_ != pp_Var2) {
      operator_delete((void *)local_f48._0_8_);
    }
    if ((char)iVar6 == '\0') {
      local_f48._16_4_ = 0x676162;
      local_f48._8_8_ = (pointer)0x3;
      local_f48._0_8_ = pp_Var2;
      iVar6 = (*poVar4->_vptr_options_i[1])(poVar4);
      if ((_func_int **)local_f48._0_8_ != pp_Var2) {
        operator_delete((void *)local_f48._0_8_);
      }
      if ((char)iVar6 == '\0') {
        local_f48._16_6_ = 0x7473726966;
        local_f48._8_8_ = (pointer)0x5;
        local_f48._0_8_ = pp_Var2;
        iVar6 = (*poVar4->_vptr_options_i[1])(poVar4);
        if ((_func_int **)local_f48._0_8_ != pp_Var2) {
          operator_delete((void *)local_f48._0_8_);
        }
        bVar3 = local_fc3;
        if ((char)iVar6 == '\0') {
          if (local_fc2 == true) {
            pcVar12->explore_type = 3;
          }
          else {
            cVar13 = '\x01';
            if (local_fc3 == false) {
              local_f48._16_8_ = 0x74706f6263676572;
              local_f48._8_8_ = (pointer)0x8;
              local_f48[0x18] = '\0';
              local_f48._0_8_ = pp_Var2;
              iVar6 = (*poVar4->_vptr_options_i[1])(poVar4);
              if ((char)iVar6 == '\0') {
                cVar13 = '\0';
              }
              else {
                cVar13 = *local_f68;
              }
            }
            pcVar12 = local_fc0;
            if ((bVar3 == false) && ((_func_int **)local_f48._0_8_ != pp_Var2)) {
              operator_delete((void *)local_f48._0_8_);
            }
            if (cVar13 == '\0') {
              local_b08[0x10] = 0x65;
              local_b08._17_2_ = 0x7370;
              local_b08[0x13] = 0x69;
              local_b08._20_2_ = 0x6f6c;
              local_b08[0x16] = 0x6e;
              local_b08._8_8_ = (pointer)0x7;
              local_b08[0x17] = 0;
              local_b08._0_8_ = local_b08 + 0x10;
              iVar6 = (*poVar4->_vptr_options_i[1])(poVar4,local_b08);
              if ((undefined1 *)local_b08._0_8_ != local_b08 + 0x10) {
                operator_delete((void *)local_b08._0_8_);
              }
              if ((char)iVar6 == '\0') {
                *local_f60 = 0.05;
              }
              local_fc0->explore_type = 1;
              pcVar12 = local_fc0;
            }
            else {
              pcVar12->explore_type = 5;
            }
          }
        }
        else {
          pcVar12->explore_type = 0;
        }
        ws = 1;
      }
      else {
        pcVar12->explore_type = 2;
        ws = pcVar12->bag_size;
      }
    }
    else {
      pcVar12->explore_type = 4;
      ws = pcVar12->cover_size + 1;
    }
    (pcVar12->gen_cs).cb_type = 2;
    pp_Var2 = (_func_int **)(local_b08 + 0x10);
    local_b08[0x10] = 99;
    local_b08._17_2_ = 0x5f62;
    local_b08[0x13] = 0x74;
    local_b08._20_2_ = 0x7079;
    local_b08[0x16] = 0x65;
    local_b08._8_8_ = (pointer)0x7;
    local_b08[0x17] = 0;
    local_b08._0_8_ = pp_Var2;
    iVar6 = (*local_fb8->_vptr_options_i[1])(local_fb8,local_b08);
    if ((_func_int **)local_b08._0_8_ != pp_Var2) {
      operator_delete((void *)local_b08._0_8_);
    }
    if ((char)iVar6 != '\0') {
      iVar6 = std::__cxx11::string::compare((char *)&local_fa8);
      if (iVar6 == 0) {
        (pcVar12->gen_cs).cb_type = 0;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_fa8);
        if (iVar6 == 0) {
          (pcVar12->gen_cs).cb_type = 2;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_fa8);
          if (iVar6 == 0) {
            local_b08[0x10] = 99;
            local_b08._17_2_ = 0x766f;
            local_b08[0x13] = 0x65;
            local_b08._20_2_ = 0x72;
            local_b08._8_8_ = (pointer)0x5;
            local_b08._0_8_ = pp_Var2;
            iVar6 = (*local_fb8->_vptr_options_i[1])();
            if ((_func_int **)local_b08._0_8_ != pp_Var2) {
              operator_delete((void *)local_b08._0_8_);
            }
            if ((char)iVar6 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&(all_00->trace_message).super_ostream,
                         "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                         ,0x59);
              std::endl<char,std::char_traits<char>>(&(all_00->trace_message).super_ostream);
            }
            (pcVar12->gen_cs).cb_type = 3;
          }
          else {
            pvVar1 = &all_00->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,
                       "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\'}; resetting to mtr.",
                       0x41);
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
            local_b08[0x10] = 99;
            local_b08._17_2_ = 0x5f62;
            local_b08[0x13] = 0x74;
            local_b08._20_2_ = 0x7079;
            local_b08[0x16] = 0x65;
            local_b08._8_8_ = (pointer)0x7;
            local_b08[0x17] = 0;
            local_990._16_4_ = 0x72746d;
            local_990._8_8_ = (pointer)0x3;
            local_b08._0_8_ = pp_Var2;
            local_990._0_8_ = local_990 + 0x10;
            (*local_fb8->_vptr_options_i[6])(local_fb8,local_b08,local_990);
            if ((undefined1 *)local_990._0_8_ != local_990 + 0x10) {
              operator_delete((void *)local_990._0_8_);
            }
            pcVar12 = local_fc0;
            if ((_func_int **)local_b08._0_8_ != pp_Var2) {
              operator_delete((void *)local_b08._0_8_);
            }
          }
        }
      }
      if ((pcVar12->explore_type == 5) && ((pcVar12->gen_cs).cb_type != 3)) {
        pvVar1 = &all_00->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,"warning: bad cb_type, RegCB only supports mtr!",0x2e);
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
    }
    l = setup_base(local_fb8,all_00);
    base = LEARNER::as_multiline<char,char>(l);
    ppuVar14 = &CB::cb_label;
    plVar15 = &local_fb0->p->lp;
    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
      plVar15->default_label = (_func_void_void_ptr *)*ppuVar14;
      ppuVar14 = ppuVar14 + (ulong)bVar16 * -2 + 1;
      plVar15 = (label_parser *)((long)plVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    local_fb0->label_type = cb;
    (pcVar12->gen_cs).scorer = local_fb0->scorer;
    pmVar9 = LEARNER::as_multiline<char,char>(local_fb0->cost_sensitive);
    pcVar12->cs_ldf_learner = pmVar9;
    plVar10 = LEARNER::
              learner<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>>
              ::init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        (pcVar12,base,CB_EXPLORE_ADF::do_actual_learning<true>,
                         CB_EXPLORE_ADF::do_actual_learning<false>,ws,action_probs);
    *(undefined8 *)(plVar10 + 0x58) = *(undefined8 *)(plVar10 + 0x18);
    *(code **)(plVar10 + 0x68) = CB_EXPLORE_ADF::finish_multiline_example;
    *(undefined8 *)(plVar10 + 0xb8) = *(undefined8 *)(plVar10 + 0x18);
    *(undefined8 *)(plVar10 + 0xc0) = *(undefined8 *)(plVar10 + 0x20);
    *(code **)(plVar10 + 200) = CB_EXPLORE_ADF::finish;
    pcVar12 = (cb_explore_adf *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_a68.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68.m_name._M_dataplus._M_p != &local_a68.m_name.field_2) {
    operator_delete(local_a68.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != &local_fa8.field_2) {
    operator_delete(local_fa8._M_dataplus._M_p);
  }
  if (pcVar12 != (cb_explore_adf *)0x0) {
    destroy_free<CB_EXPLORE_ADF::cb_explore_adf>(pcVar12);
  }
  return (base_learner *)plVar10;
}

Assistant:

base_learner* cb_explore_adf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore_adf>();
  bool cb_explore_adf_option = false;
  bool softmax = false;
  bool regcb = false;
  std::string type_string = "mtr";
  option_group_definition new_options("Contextual Bandit Exploration with Action Dependent Features");
  new_options
      .add(make_option("cb_explore_adf", cb_explore_adf_option)
               .keep()
               .help("Online explore-exploit for a contextual bandit problem with multiline action dependent features"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"))
      .add(make_option("nounif", data->nounif)
               .keep()
               .help("do not explore uniformly on zero-probability actions in cover"))
      .add(make_option("softmax", softmax).keep().help("softmax exploration"))
      .add(make_option("regcb", regcb).keep().help("RegCB-elim exploration"))
      .add(make_option("regcbopt", data->regcbopt).keep().help("RegCB optimistic exploration"))
      .add(make_option("mellowness", data->c0)
               .keep()
               .default_value(0.1f)
               .help("RegCB mellowness parameter c_0. Default 0.1"))
      .add(make_option("greedify", data->greedify).keep().help("always update first policy once in bagging"))
      .add(make_option("cb_min_cost", data->min_cb_cost).keep().default_value(0.f).help("lower bound on cost"))
      .add(make_option("cb_max_cost", data->max_cb_cost).keep().default_value(1.f).help("upper bound on cost"))
      .add(make_option("first_only", data->first_only)
               .keep()
               .help("Only explore the first action in a tie-breaking event"))
      .add(make_option("lambda", data->lambda).keep().default_value(-1.f).help("parameter for softmax"))
      .add(make_option("cb_type", type_string)
               .keep()
               .help("contextual bandit method to use in {ips,dr,mtr}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_explore_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  data->all = &all;
  if (data->lambda > 0)  // Lambda should always be negative because we are using a cost basis.
    data->lambda = -data->lambda;

  if (!options.was_supplied("cb_adf"))
  {
    options.insert("cb_adf", "");
  }

  all.delete_prediction = delete_action_scores;

  size_t problem_multiplier = 1;

  if (options.was_supplied("cover"))
  {
    data->explore_type = COVER;
    problem_multiplier = data->cover_size + 1;
  }
  else if (options.was_supplied("bag"))
  {
    data->explore_type = BAG_EXPLORE;
    problem_multiplier = data->bag_size;
  }
  else if (options.was_supplied("first"))
    data->explore_type = EXPLORE_FIRST;
  else if (softmax)
    data->explore_type = SOFTMAX;
  else if (regcb || (options.was_supplied("regcbopt") && data->regcbopt))
    data->explore_type = REGCB;
  else
  {
    if (!options.was_supplied("epsilon"))
      data->epsilon = 0.05f;
    data->explore_type = EPS_GREEDY;
  }

  data->gen_cs.cb_type = CB_TYPE_IPS;
  if (options.was_supplied("cb_type"))
  {
    if (type_string.compare("dr") == 0)
      data->gen_cs.cb_type = CB_TYPE_DR;
    else if (type_string.compare("ips") == 0)
      data->gen_cs.cb_type = CB_TYPE_IPS;
    else if (type_string.compare("mtr") == 0)
    {
      if (options.was_supplied("cover"))
        all.trace_message << "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                          << endl;
      data->gen_cs.cb_type = CB_TYPE_MTR;
    }
    else
    {
      all.trace_message << "warning: cb_type must be in {'ips','dr','mtr'}; resetting to mtr." << std::endl;
      options.replace("cb_type", "mtr");
    }

    if (data->explore_type == REGCB && data->gen_cs.cb_type != CB_TYPE_MTR)
      all.trace_message << "warning: bad cb_type, RegCB only supports mtr!" << std::endl;
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  // Extract from lower level reductions.
  data->gen_cs.scorer = all.scorer;
  data->cs_ldf_learner = as_multiline(all.cost_sensitive);

  learner<cb_explore_adf, multi_ex>& l = init_learner(data, base, CB_EXPLORE_ADF::do_actual_learning<true>,
      CB_EXPLORE_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_probs);

  l.set_finish_example(CB_EXPLORE_ADF::finish_multiline_example);
  l.set_finish(CB_EXPLORE_ADF::finish);
  return make_base(l);
}